

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_linux.cpp
# Opt level: O2

uint QNetworkInterfaceManager::interfaceIndexFromName(QString *name)

{
  long lVar1;
  int __fd;
  int iVar2;
  undefined4 uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_70;
  ifreq req;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  if ((ulong)(name->d).size < 0x10) {
    uVar3 = 0;
    __fd = ::socket(2,0x80002,0);
    if (-1 < __fd) {
      req.ifr_ifru.ifru_map.mem_end = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      req.ifr_ifru._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      req.ifr_ifrn._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      req.ifr_ifrn._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      req.ifr_ifru.ifru_data = (void *)0xaaaaaaaa00000000;
      QString::toLatin1_helper((QString *)&local_70);
      if (local_70.ptr == (char *)0x0) {
        local_70.ptr = (char *)&QByteArray::_empty;
      }
      __strcpy_chk(&req,local_70.ptr,0x28);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
      iVar2 = ioctl(__fd,0x8933,&req);
      uVar3 = 0;
      if (-1 < iVar2) {
        uVar3 = req.ifr_ifru.ifru_ivalue;
      }
      qt_safe_close(__fd);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

uint QNetworkInterfaceManager::interfaceIndexFromName(const QString &name)
{
    uint index = 0;
    if (name.size() >= IFNAMSIZ)
        return index;

    int socket = qt_safe_socket(AF_INET, SOCK_DGRAM, 0);
    if (socket >= 0) {
        struct ifreq req;
        req.ifr_ifindex = 0;
        strcpy(req.ifr_name, name.toLatin1().constData());

        if (qt_safe_ioctl(socket, SIOCGIFINDEX, &req) >= 0)
            index = req.ifr_ifindex;
        qt_safe_close(socket);
    }
    return index;
}